

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

void __thiscall
jsonip::detail::stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_>::array_start
          (stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_> *this,holder *h)

{
  long *plVar1;
  
  plVar1 = (long *)h->t;
  if (plVar1[1] != *plVar1) {
    plVar1[1] = *plVar1;
  }
  return;
}

Assistant:

void array_start(holder& h) const { h.get<T>().clear(); }